

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O1

uint64_t Assimp::FBX::ParseTokenAsID(Token *t)

{
  uint64_t uVar1;
  char *err;
  allocator<char> local_39;
  char *local_38;
  string local_30;
  
  uVar1 = ParseTokenAsID(t,&local_38);
  if (local_38 == (char *)0x0) {
    return uVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,local_38,&local_39);
  anon_unknown.dwarf_1084233::ParseError(&local_30,t);
}

Assistant:

uint64_t ParseTokenAsID(const Token& t)
{
    const char* err;
    const uint64_t i = ParseTokenAsID(t,err);
    if(err) {
        ParseError(err,t);
    }
    return i;
}